

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialized_message.h
# Opt level: O0

SerializedMessage * __thiscall
miniros::SerializedMessage::operator=(SerializedMessage *this,SerializedMessage *param_2)

{
  shared_ptr<const_void> *in_RSI;
  SerializedMessage *in_RDI;
  
  std::shared_ptr<unsigned_char[]>::operator=((shared_ptr<unsigned_char[]> *)in_RSI,&in_RDI->buf);
  in_RDI->num_bytes =
       (size_t)in_RSI[1].super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  in_RDI->message_start =
       (uint8_t *)
       in_RSI[1].super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  std::shared_ptr<const_void>::operator=(in_RSI,(shared_ptr<const_void> *)in_RDI);
  in_RDI->type_info =
       (type_info *)in_RSI[3].super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  return in_RDI;
}

Assistant:

class MINIROS_DECL SerializedMessage
{
public:
  using shared_array_uint8_t = std::shared_ptr<uint8_t[]>;
  shared_array_uint8_t buf;
  size_t num_bytes;
  uint8_t* message_start;

  std::shared_ptr<void const> message;
  const std::type_info* type_info;

  SerializedMessage()
  : buf(shared_array_uint8_t())
  , num_bytes(0)
  , message_start(0)
  , type_info(0)
  {}

  SerializedMessage(shared_array_uint8_t buf, size_t num_bytes)
  : buf(buf)
  , num_bytes(num_bytes)
  , message_start(buf ? buf.get() : 0)
  , type_info(0)
  { }
}